

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O3

bool __thiscall
spvtools::val::BasicBlock::structurally_postdominates(BasicBlock *this,BasicBlock *other)

{
  bool bVar1;
  BasicBlock *local_90;
  DominatorIterator local_88;
  DominatorIterator local_60;
  DominatorIterator local_38;
  
  if (this == other) {
    bVar1 = true;
  }
  else {
    local_60.dom_func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_60.dom_func_.super__Function_base._M_functor._8_8_ = 0;
    local_60.dom_func_._M_invoker =
         std::
         _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
         ::_M_invoke;
    local_60.dom_func_.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
         ::_M_manager;
    local_38.current_ = (BasicBlock *)0x0;
    local_38.dom_func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_38.dom_func_.super__Function_base._M_functor._8_8_ = 0;
    local_38.dom_func_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_38.dom_func_._M_invoker = (_Invoker_type)0x0;
    local_90 = this;
    local_60.current_ = other;
    std::
    __find_if<spvtools::val::BasicBlock::DominatorIterator,__gnu_cxx::__ops::_Iter_equals_val<spvtools::val::BasicBlock_const*const>>
              (&local_88,&local_60,&local_38,
               (_Iter_equals_val<const_spvtools::val::BasicBlock_*const>)&local_90);
    if (local_38.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_38.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_38.dom_func_,(_Any_data *)&local_38.dom_func_,__destroy_functor
                );
    }
    if (local_60.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_60.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_60.dom_func_,(_Any_data *)&local_60.dom_func_,__destroy_functor
                );
    }
    bVar1 = local_88.current_ != (BasicBlock *)0x0;
    if (local_88.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_88.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_88.dom_func_,(_Any_data *)&local_88.dom_func_,__destroy_functor
                );
    }
  }
  return bVar1;
}

Assistant:

bool BasicBlock::structurally_postdominates(const BasicBlock& other) const {
  return (this == &other) || !(other.structural_pdom_end() ==
                               std::find(other.structural_pdom_begin(),
                                         other.structural_pdom_end(), this));
}